

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_process_goaway_frame(nghttp2_session *session)

{
  int iVar1;
  nghttp2_frame *frame;
  nghttp2_inbound_frame *iframe;
  nghttp2_session *session_local;
  
  nghttp2_frame_unpack_goaway_payload
            ((nghttp2_goaway *)&session->iframe,(session->iframe).sbuf.pos,
             (session->iframe).lbuf.pos,
             (long)(session->iframe).lbuf.last - (long)(session->iframe).lbuf.pos);
  nghttp2_buf_wrap_init(&(session->iframe).lbuf,(uint8_t *)0x0,0);
  iVar1 = nghttp2_session_on_goaway_received(session,&(session->iframe).frame);
  return iVar1;
}

Assistant:

static int session_process_goaway_frame(nghttp2_session *session) {
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_frame *frame = &iframe->frame;

  nghttp2_frame_unpack_goaway_payload(&frame->goaway, iframe->sbuf.pos,
                                      iframe->lbuf.pos,
                                      nghttp2_buf_len(&iframe->lbuf));

  nghttp2_buf_wrap_init(&iframe->lbuf, NULL, 0);

  return nghttp2_session_on_goaway_received(session, frame);
}